

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_logger.cpp
# Opt level: O0

void __thiscall
duckdb::SQLLogicTestLogger::UnexpectedStatement
          (SQLLogicTestLogger *this,bool expect_ok,MaterializedQueryResult *result)

{
  char *this_00;
  byte in_SIL;
  string *in_RDI;
  SQLLogicTestLogger *in_stack_000000a0;
  allocator local_39;
  string local_38 [47];
  byte local_9;
  
  local_9 = in_SIL & 1;
  this_00 = "Query unexpectedly succeeded!";
  if (local_9 != 0) {
    this_00 = "Query unexpectedly failed!";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,this_00,&local_39);
  PrintErrorHeader((SQLLogicTestLogger *)this_00,in_RDI);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  PrintLineSep();
  PrintSQL(in_stack_000000a0);
  PrintLineSep();
  duckdb::QueryResult::Print();
  return;
}

Assistant:

void SQLLogicTestLogger::UnexpectedStatement(bool expect_ok, MaterializedQueryResult &result) {
	PrintErrorHeader(!expect_ok ? "Query unexpectedly succeeded!" : "Query unexpectedly failed!");
	PrintLineSep();
	PrintSQL();
	PrintLineSep();
	result.Print();
}